

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# film_grain_table_test.cc
# Opt level: O0

void __thiscall
FilmGrainTableIOTest_ReadTruncatedFile_Test::TestBody
          (FilmGrainTableIOTest_ReadTruncatedFile_Test *this)

{
  bool bVar1;
  undefined1 uVar2;
  aom_codec_err_t aVar3;
  char *__filename;
  aom_film_grain_table_t *in_RDI;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  FILE *file;
  string grain_file;
  aom_film_grain_table_t table;
  undefined7 in_stack_fffffffffffffef0;
  undefined1 in_stack_fffffffffffffef7;
  _IO_FILE **in_stack_fffffffffffffef8;
  undefined4 in_stack_ffffffffffffff00;
  undefined4 uVar4;
  undefined4 in_stack_ffffffffffffff04;
  aom_internal_error_info *in_stack_ffffffffffffff08;
  int line;
  undefined7 in_stack_ffffffffffffff10;
  undefined1 uVar5;
  Type type;
  string *this_00;
  AssertionResult local_b8 [2];
  undefined4 in_stack_ffffffffffffff68;
  aom_codec_err_t aVar6;
  undefined4 in_stack_ffffffffffffff6c;
  undefined4 uVar7;
  AssertHelper *in_stack_ffffffffffffff70;
  undefined1 in_stack_ffffffffffffff97;
  string *in_stack_ffffffffffffff98;
  AssertionResult local_60 [2];
  FILE *local_40;
  string local_38 [32];
  undefined8 local_18;
  undefined8 uStack_10;
  
  local_18 = 0;
  uStack_10 = 0;
  this_00 = local_38;
  std::__cxx11::string::string(this_00);
  local_40 = (FILE *)libaom_test::GetTempOutFile
                               (in_stack_ffffffffffffff98,(bool)in_stack_ffffffffffffff97);
  testing::internal::CmpHelperNE<_IO_FILE*,decltype(nullptr)>
            ((char *)in_stack_ffffffffffffff08,
             (char *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
             in_stack_fffffffffffffef8,
             (void **)CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_60);
  uVar5 = bVar1;
  if (!bVar1) {
    testing::Message::Message((Message *)this_00);
    in_stack_ffffffffffffff08 =
         (aom_internal_error_info *)
         testing::AssertionResult::failure_message((AssertionResult *)0x5600f2);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)this_00,(Type)((ulong)in_RDI >> 0x20),
               (char *)CONCAT17(uVar5,in_stack_ffffffffffffff10),
               (int)((ulong)in_stack_ffffffffffffff08 >> 0x20),
               (char *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
    testing::internal::AssertHelper::operator=
              (in_stack_ffffffffffffff70,
               (Message *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0));
    testing::Message::~Message((Message *)0x56014f);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x5601bd);
  if (bVar1) {
    fwrite("deadbeef",8,1,local_40);
    fclose(local_40);
    uVar7 = 1;
    std::__cxx11::string::c_str();
    aVar3 = aom_film_grain_table_read
                      (in_RDI,(char *)CONCAT17(uVar5,in_stack_ffffffffffffff10),
                       in_stack_ffffffffffffff08);
    type = (Type)((ulong)in_RDI >> 0x20);
    aVar6 = aVar3;
    testing::internal::EqHelper::Compare<aom_codec_err_t,_aom_codec_err_t,_nullptr>
              ((char *)in_stack_ffffffffffffff08,(char *)CONCAT44(aVar3,in_stack_ffffffffffffff00),
               (aom_codec_err_t *)in_stack_fffffffffffffef8,
               (aom_codec_err_t *)CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0));
    bVar1 = testing::AssertionResult::operator_cast_to_bool
                      ((AssertionResult *)&stack0xffffffffffffff70);
    uVar4 = CONCAT13(bVar1,(int3)in_stack_ffffffffffffff00);
    if (!bVar1) {
      testing::Message::Message((Message *)this_00);
      in_stack_fffffffffffffef8 =
           (_IO_FILE **)testing::AssertionResult::failure_message((AssertionResult *)0x5602d2);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)this_00,type,(char *)CONCAT17(uVar5,in_stack_ffffffffffffff10),
                 (int)((ulong)in_stack_ffffffffffffff08 >> 0x20),(char *)CONCAT44(aVar3,uVar4));
      testing::internal::AssertHelper::operator=
                (in_stack_ffffffffffffff70,(Message *)CONCAT44(uVar7,aVar6));
      testing::internal::AssertHelper::~AssertHelper
                ((AssertHelper *)CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0));
      testing::Message::~Message((Message *)0x560320);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x560388);
    if (bVar1) {
      __filename = (char *)std::__cxx11::string::c_str();
      remove(__filename);
      testing::internal::EqHelper::Compare<int,_int,_nullptr>
                ((char *)in_stack_ffffffffffffff08,(char *)CONCAT44(aVar3,uVar4),
                 (int *)in_stack_fffffffffffffef8,
                 (int *)CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0));
      line = (int)((ulong)in_stack_ffffffffffffff08 >> 0x20);
      uVar2 = testing::AssertionResult::operator_cast_to_bool(local_b8);
      if (!(bool)uVar2) {
        testing::Message::Message((Message *)this_00);
        testing::AssertionResult::failure_message((AssertionResult *)0x56043e);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)this_00,type,(char *)CONCAT17(uVar5,in_stack_ffffffffffffff10),
                   line,(char *)CONCAT44(aVar3,uVar4));
        testing::internal::AssertHelper::operator=
                  (in_stack_ffffffffffffff70,(Message *)CONCAT44(uVar7,aVar6));
        testing::internal::AssertHelper::~AssertHelper
                  ((AssertHelper *)CONCAT17(uVar2,in_stack_fffffffffffffef0));
        testing::Message::~Message((Message *)0x56048a);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x5604d6);
    }
  }
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

TEST_F(FilmGrainTableIOTest, ReadTruncatedFile) {
  aom_film_grain_table_t table;
  memset(&table, 0, sizeof(table));

  std::string grain_file;
  FILE *file = libaom_test::GetTempOutFile(&grain_file);
  ASSERT_NE(file, nullptr);
  fwrite("deadbeef", 8, 1, file);
  fclose(file);
  ASSERT_EQ(AOM_CODEC_ERROR,
            aom_film_grain_table_read(&table, grain_file.c_str(), &error_));
  EXPECT_EQ(0, remove(grain_file.c_str()));
}